

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::Configurations::unsafeSetGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  char cVar1;
  undefined8 uVar2;
  undefined7 in_register_00000009;
  EnumType lIndex;
  ushort local_4c;
  ConfigurationType local_4a;
  undefined8 *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  local_4a = configurationType;
  if ((int)CONCAT71(in_register_00000009,includeGlobalLevel) != 0) {
    unsafeSet(this,Global,configurationType,value);
  }
  local_4c = 2;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48 = (undefined8 *)0x0;
  uStack_40 = 0;
  local_48 = (undefined8 *)operator_new(0x20);
  *local_48 = this;
  local_48[1] = &local_4c;
  local_48[2] = &local_4a;
  local_48[3] = value;
  pcStack_30 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/third_party/easylogging++/easylogging++.h:2972:40)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/third_party/easylogging++/easylogging++.h:2972:40)>
             ::_M_manager;
  do {
    if (local_38 == (code *)0x0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    cVar1 = (*pcStack_30)(&local_48);
  } while ((cVar1 == '\0') && (local_4c = local_4c * 2, local_4c < 0x81));
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

void unsafeSetGlobally(ConfigurationType configurationType, const std::string& value, bool includeGlobalLevel) {
    if (includeGlobalLevel) {
      unsafeSet(Level::Global, configurationType, value);
    }
    base::type::EnumType lIndex = LevelHelper::kMinValid;
    LevelHelper::forEachLevel(&lIndex, [&](void) -> bool  {
      unsafeSet(LevelHelper::castFromInt(lIndex), configurationType, value);
      return false;  // Do not break lambda function yet as we need to set all levels regardless
    });
  }